

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O0

int __thiscall front::symbol::ArraySymbol::getLen(ArraySymbol *this)

{
  int iVar1;
  int iVar2;
  element_type *this_00;
  long in_RDI;
  ArraySymbol *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  if (*(int *)(in_RDI + 0x44) == -1) {
    getSize(in_stack_00000028);
  }
  iVar1 = *(int *)(in_RDI + 0x44);
  std::static_pointer_cast<front::symbol::IntSymbol,front::symbol::Symbol>
            ((shared_ptr<front::symbol::Symbol> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  this_00 = std::
            __shared_ptr_access<front::symbol::IntSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<front::symbol::IntSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2b156c);
  iVar2 = IntSymbol::getSize(this_00);
  std::shared_ptr<front::symbol::IntSymbol>::~shared_ptr
            ((shared_ptr<front::symbol::IntSymbol> *)0x2b1592);
  return iVar1 / iVar2;
}

Assistant:

int getLen() {
    if (_size == -1) {
      getSize();
    }

    return _size / static_pointer_cast<IntSymbol>(_item)->getSize();
  }